

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O0

void av1_highbd_dist_wtd_convolve_2d_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params,int bd)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  long lVar4;
  uint16_t uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int16_t *piVar10;
  byte bVar11;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int32_t tmp;
  CONV_BUF_TYPE res;
  InterpFilterParams *in_stack_00000008;
  int32_t sum_1;
  int16_t *y_filter;
  uint in_stack_00000018;
  int offset_bits;
  int16_t *src_vert;
  int *in_stack_00000028;
  int32_t sum;
  int16_t *x_filter;
  uint16_t *src_horiz;
  int round_bits;
  int fo_horiz;
  int fo_vert;
  int im_stride;
  int im_h;
  int dst16_stride;
  CONV_BUF_TYPE *dst16;
  int16_t im_block [17792];
  int k;
  int y;
  int x;
  int in_stack_ffffffffffff7470;
  int local_8b8c;
  int local_8b6c;
  short local_8b38 [17796];
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  long local_18;
  int local_c;
  
  lVar4 = *(long *)(in_stack_00000028 + 2);
  iVar3 = in_stack_00000028[4];
  uVar1 = y_filter[4];
  iVar6 = (ushort)y_filter[4] / 2 - 1;
  uVar2 = in_stack_00000008->taps;
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  piVar10 = av1_get_interp_filter_subpel_kernel(in_stack_00000008,in_stack_00000018 & 0xf);
  for (local_2c = 0; local_2c < (int)(in_R9D + (uint)uVar1 + -1); local_2c = local_2c + 1) {
    for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
      local_8b6c = 1 << ((char)x_filter + 6U & 0x1f);
      for (local_30 = 0; local_30 < (int)(uint)in_stack_00000008->taps; local_30 = local_30 + 1) {
        local_8b6c = (int)piVar10[local_30] *
                     (uint)*(ushort *)
                            (in_RDI + (long)(iVar6 * in_ESI) * -2 +
                            (long)(int)(((local_2c * local_c + local_28) - (uVar2 / 2 - 1)) +
                                       local_30) * 2) + local_8b6c;
      }
      local_8b38[local_2c * in_R8D + local_28] =
           (short)(local_8b6c + ((1 << ((byte)in_stack_00000028[5] & 0x1f)) >> 1) >>
                  ((byte)in_stack_00000028[5] & 0x1f));
    }
  }
  bVar11 = ((char)x_filter + '\x0e') - (char)in_stack_00000028[5];
  piVar10 = av1_get_interp_filter_subpel_kernel((InterpFilterParams *)y_filter,(uint)src_vert & 0xf)
  ;
  for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
    for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
      local_8b8c = 1 << (bVar11 & 0x1f);
      for (local_30 = 0; local_30 < (int)(uint)(ushort)y_filter[4]; local_30 = local_30 + 1) {
        local_8b8c = (int)piVar10[local_30] *
                     (int)local_8b38
                          [(long)(iVar6 * in_R8D) +
                           (long)(((local_2c - iVar6) + local_30) * in_R8D + local_28)] + local_8b8c
        ;
      }
      uVar7 = local_8b8c + ((1 << ((byte)in_stack_00000028[6] & 0x1f)) >> 1) >>
              ((byte)in_stack_00000028[6] & 0x1f);
      in_stack_ffffffffffff7470 = CONCAT22((short)uVar7,(short)in_stack_ffffffffffff7470);
      if (*in_stack_00000028 == 0) {
        *(short *)(lVar4 + (long)(local_2c * iVar3 + local_28) * 2) = (short)uVar7;
      }
      else {
        uVar8 = (uint)*(ushort *)(lVar4 + (long)(local_2c * iVar3 + local_28) * 2);
        if (in_stack_00000028[9] == 0) {
          iVar9 = (int)((uVar7 & 0xffff) + uVar8) >> 1;
        }
        else {
          iVar9 = (int)(uVar8 * in_stack_00000028[10] + (uVar7 & 0xffff) * in_stack_00000028[0xb])
                  >> 4;
        }
        uVar5 = clip_pixel_highbd(in_stack_ffffffffffff7470,
                                  iVar9 - ((1 << (bVar11 - (char)in_stack_00000028[6] & 0x1f)) +
                                          (1 << ((bVar11 - (char)in_stack_00000028[6]) - 1 & 0x1f)))
                                 );
        *(uint16_t *)(local_18 + (long)(local_2c * local_1c + local_28) * 2) = uVar5;
      }
    }
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_2d_c(
    const uint16_t *src, int src_stride, uint16_t *dst, int dst_stride, int w,
    int h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int subpel_x_qn,
    const int subpel_y_qn, ConvolveParams *conv_params, int bd) {
  int x, y, k;
  int16_t im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE];
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  int dst16_stride = conv_params->dst_stride;
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = w;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  assert(round_bits >= 0);

  // horizontal filter
  const uint16_t *src_horiz = src - fo_vert * src_stride;
  const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_x, subpel_x_qn & SUBPEL_MASK);
  for (y = 0; y < im_h; ++y) {
    for (x = 0; x < w; ++x) {
      int32_t sum = (1 << (bd + FILTER_BITS - 1));
      for (k = 0; k < filter_params_x->taps; ++k) {
        sum += x_filter[k] * src_horiz[y * src_stride + x - fo_horiz + k];
      }
      assert(filter_params_x->taps > 8 ||
             (0 <= sum && sum < (1 << (bd + FILTER_BITS + 1))));
      (void)bd;
      im_block[y * im_stride + x] =
          (int16_t)ROUND_POWER_OF_TWO(sum, conv_params->round_0);
    }
  }

  // vertical filter
  int16_t *src_vert = im_block + fo_vert * im_stride;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_y, subpel_y_qn & SUBPEL_MASK);
  for (y = 0; y < h; ++y) {
    for (x = 0; x < w; ++x) {
      int32_t sum = 1 << offset_bits;
      for (k = 0; k < filter_params_y->taps; ++k) {
        sum += y_filter[k] * src_vert[(y - fo_vert + k) * im_stride + x];
      }
      assert(filter_params_y->taps > 8 ||
             (0 <= sum && sum < (1 << (offset_bits + 2))));
      CONV_BUF_TYPE res = ROUND_POWER_OF_TWO(sum, conv_params->round_1);
      if (conv_params->do_average) {
        int32_t tmp = dst16[y * dst16_stride + x];
        if (conv_params->use_dist_wtd_comp_avg) {
          tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
          tmp = tmp >> DIST_PRECISION_BITS;
        } else {
          tmp += res;
          tmp = tmp >> 1;
        }
        tmp -= (1 << (offset_bits - conv_params->round_1)) +
               (1 << (offset_bits - conv_params->round_1 - 1));
        dst[y * dst_stride + x] =
            clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp, round_bits), bd);
      } else {
        dst16[y * dst16_stride + x] = res;
      }
    }
  }
}